

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> * __thiscall
wasm::WATParser::anon_unknown_10::hexnum
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in,OverflowBehavior overflow)

{
  bool bVar1;
  size_t sVar2;
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *poVar3;
  uint64_t uVar4;
  string_view sv;
  undefined1 local_50 [8];
  LexIntCtx ctx;
  
  ctx.super_LexCtx.input._M_len = in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.super_LexCtx.lexedSize._0_5_ = 0;
  ctx.super_LexCtx.lexedSize._5_3_ = 0;
  ctx.n._0_4_ = 0;
  ctx.n._4_1_ = '\0';
  local_50 = (undefined1  [8])this;
  bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_50);
  if (bVar1) {
    do {
      while (sv._M_str = "_", sv._M_len = 1, sVar2 = LexCtx::startsWith((LexCtx *)local_50,sv),
            sVar2 != 0) {
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
        bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_50);
        if (!bVar1) goto LAB_009e4efd;
      }
      bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)local_50);
    } while (bVar1);
    if ((int)in._M_str == 0) {
      if ((ctx.n._4_1_ != '\0') || (ctx.super_LexCtx.input._M_str == (char *)0x0))
      goto LAB_009e4efd;
      if ((ulong)local_50 < ctx.super_LexCtx.input._M_str) {
        ctx.super_LexCtx.input._M_str = (char *)local_50;
      }
      poVar3 = (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)(ulong)(uint)ctx.n;
      uVar4 = -CONCAT35(ctx.super_LexCtx.lexedSize._5_3_,(undefined5)ctx.super_LexCtx.lexedSize);
      if ((uint)ctx.n != 2) {
        uVar4 = CONCAT35(ctx.super_LexCtx.lexedSize._5_3_,(undefined5)ctx.super_LexCtx.lexedSize);
      }
    }
    else {
      poVar3 = (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)0x0;
      if (ctx.super_LexCtx.input._M_str == (char *)0x0) goto LAB_009e4eff;
      if ((ulong)local_50 < ctx.super_LexCtx.input._M_str) {
        ctx.super_LexCtx.input._M_str = (char *)local_50;
      }
      uVar4 = 0;
    }
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_len = (size_t)ctx.super_LexCtx.input._M_str;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.super_LexResult.span._M_str = (char *)ctx.super_LexCtx.input._M_len;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.n = uVar4;
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_payload._M_value.sign = (Sign)poVar3;
    poVar3 = (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
             CONCAT71((int7)((ulong)poVar3 >> 8),1);
  }
  else {
LAB_009e4efd:
    poVar3 = (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)0x0;
  }
LAB_009e4eff:
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)._M_payload
  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_engaged =
       SUB81(poVar3,0);
  return poVar3;
}

Assistant:

std::optional<LexIntResult>
hexnum(std::string_view in, OverflowBehavior overflow = DisallowOverflow) {
  LexIntCtx ctx(in);
  if (!ctx.takeHexdigit()) {
    return {};
  }
  while (true) {
    bool under = ctx.takePrefix("_"sv);
    if (!ctx.takeHexdigit()) {
      if (!under) {
        return overflow == DisallowOverflow ? ctx.lexed() : ctx.lexedRaw();
      }
      // TODO: Add error production for trailing underscore.
      return {};
    }
  }
}